

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellBST::SetLayerZreference(ChElementShellBST *this,double z_from_bottom)

{
  pointer pLVar1;
  pointer pLVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  iterator iVar6;
  double dVar7;
  double local_40;
  double local_38;
  
  this->tot_thickness = 0.0;
  pLVar2 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar1 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)pLVar2 - (long)pLVar1 != 0) {
    pdVar5 = &pLVar1->m_thickness;
    dVar7 = 0.0;
    lVar3 = ((long)pLVar2 - (long)pLVar1 >> 3) * -0x3333333333333333;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    do {
      dVar7 = dVar7 + *pdVar5;
      pdVar5 = pdVar5 + 5;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    this->tot_thickness = dVar7;
  }
  pdVar5 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6._M_current =
       (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current != pdVar5) {
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar5;
    iVar6._M_current = pdVar5;
  }
  local_38 = z_from_bottom;
  if (iVar6._M_current ==
      (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->m_layers_z,iVar6,&local_38);
    pLVar1 = (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar6._M_current = z_from_bottom;
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  if (pLVar2 != pLVar1) {
    lVar3 = 3;
    uVar4 = 0;
    do {
      local_40 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4] + (double)(&pLVar1->m_element)[lVar3];
      iVar6._M_current =
           (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->m_layers_z,iVar6,&local_40);
        pLVar1 = (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar2 = (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar6._M_current = local_40;
        (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 5;
    } while (uVar4 < (ulong)(((long)pLVar2 - (long)pLVar1 >> 3) * -0x3333333333333333));
  }
  return;
}

Assistant:

void ChElementShellBST::SetLayerZreference(double z_from_bottom) {
    // accumulate element thickness.
    tot_thickness = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        tot_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the z levels of layers, by centering them
    m_layers_z.clear();
    m_layers_z.push_back(z_from_bottom);
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers_z.push_back(m_layers_z[kl] + m_layers[kl].Get_thickness());
    }
}